

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O2

reference __thiscall bitdeque<32768>::back(bitdeque<32768> *this)

{
  bitdeque<32768> *in_RSI;
  long in_FS_OFFSET;
  reference rVar1;
  reference rVar2;
  iterator local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  end(&local_40,in_RSI);
  rVar1 = Iterator<false>::operator[]((Iterator<false> *)this,(difference_type)&local_40);
  rVar2._M_bpos = rVar1._M_bpos;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    rVar2._M_wp = (_WordT *)this;
    return rVar2;
  }
  __stack_chk_fail();
}

Assistant:

reference back() { return end()[-1]; }